

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BBLIter __thiscall mocker::ir::FunctionModule::insertBBAfter(FunctionModule *this,BBLIter iter)

{
  bool bVar1;
  iterator iVar2;
  size_t local_38;
  const_iterator local_30;
  _Self local_28;
  FunctionModule *local_20;
  FunctionModule *this_local;
  BBLIter iter_local;
  
  local_20 = this;
  this_local = (FunctionModule *)iter._M_node;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (&this->bbs);
  bVar1 = std::operator!=((_Self *)&this_local,&local_28);
  if (!bVar1) {
    __assert_fail("iter != bbs.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/module.cpp"
                  ,0x40,"BBLIter mocker::ir::FunctionModule::insertBBAfter(BBLIter)");
  }
  std::_List_iterator<mocker::ir::BasicBlock>::operator++
            ((_List_iterator<mocker::ir::BasicBlock> *)&this_local);
  std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
            (&local_30,(iterator *)&this_local);
  local_38 = this->bbsSz;
  this->bbsSz = local_38 + 1;
  iVar2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
          emplace<unsigned_long>(&this->bbs,local_30,&local_38);
  return (BBLIter)iVar2._M_node;
}

Assistant:

BBLIter FunctionModule::insertBBAfter(BBLIter iter) {
  assert(iter != bbs.end());
  ++iter;
  return bbs.emplace(iter, bbsSz++);
}